

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmrun.cpp
# Opt level: O1

uchar * __thiscall
CVmRun::do_call_func_nr(CVmRun *this,uint caller_ofs,pool_ofs_t target_ofs,uint argc)

{
  byte *pbVar1;
  ushort uVar2;
  char *pcVar3;
  vm_datatype_t *pvVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  vm_val_t *pvVar8;
  uchar *puVar9;
  vm_val_t *pvVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  int iVar15;
  undefined1 auVar14 [16];
  undefined1 auVar16 [16];
  int iVar18;
  undefined1 auVar17 [16];
  
  pvVar10 = sp_;
  r0_.typ = VM_NIL;
  pcVar3 = G_code_pool_X.super_CVmPoolPaged.pages_
           [target_ofs >> ((byte)G_code_pool_X.super_CVmPoolPaged.log2_page_size_ & 0x1f)].mem;
  uVar12 = (ulong)(G_code_pool_X.super_CVmPoolPaged._8_4_ - 1 & target_ofs);
  if ((this->super_CVmStack).max_depth_ <
      (ulong)*(ushort *)(pcVar3 + uVar12 + 4) + ((long)sp_ - (long)(this->super_CVmStack).arr_ >> 4)
      + 0xb) {
    err_throw(0x8ff);
  }
  pbVar1 = (byte *)(pcVar3 + uVar12);
  uVar2 = *(ushort *)(pcVar3 + uVar12 + 2);
  pvVar4 = &sp_->typ;
  sp_ = sp_ + (ulong)uVar2 + 0xb;
  *pvVar4 = VM_PROP;
  (pvVar10->val).prop = 0;
  pvVar10[1].typ = VM_NIL;
  pvVar10[2].typ = VM_NIL;
  pvVar10[3].typ = VM_NIL;
  pvVar10[3].val.obj = 0;
  pvVar10[4].typ = VM_FUNCPTR;
  pvVar10[4].val.ofs = target_ofs;
  pvVar10[5].typ = VM_NIL;
  pvVar10[6].typ = VM_CODEPTR;
  pvVar10[6].val.ptr = (void *)0x0;
  pvVar10[7].typ = VM_CODEOFS;
  pvVar10[7].val.obj = caller_ofs;
  puVar9 = entry_ptr_native_;
  pvVar10[8].typ = VM_CODEPTR;
  pvVar10[8].val.ptr = puVar9;
  pvVar10[9].typ = VM_INT;
  pvVar10[9].val.obj = argc;
  pvVar8 = frame_ptr_;
  pvVar10[10].typ = VM_STACK;
  pvVar10[10].val.native_desc = (CVmNativeCodeDesc *)pvVar8;
  auVar7 = _DAT_00299d30;
  auVar6 = _DAT_00299d20;
  auVar5 = _DAT_00299670;
  uVar11 = *pbVar1 & 0x7f;
  if ((((int)argc < (int)uVar11) || ((int)(pbVar1[1] + uVar11) < (int)argc)) &&
     ((-1 < (char)*pbVar1 || ((int)argc <= (int)uVar11)))) {
    err_throw(0x899);
  }
  frame_ptr_ = pvVar10 + 0xb;
  entry_ptr_native_ = pbVar1;
  if ((ulong)uVar2 != 0) {
    lVar13 = (ulong)uVar2 - 1;
    auVar14._8_4_ = (int)lVar13;
    auVar14._0_8_ = lVar13;
    auVar14._12_4_ = (int)((ulong)lVar13 >> 0x20);
    pvVar10 = pvVar10 + 0xe;
    uVar12 = 0;
    auVar14 = auVar14 ^ _DAT_00299d30;
    do {
      auVar16._8_4_ = (int)uVar12;
      auVar16._0_8_ = uVar12;
      auVar16._12_4_ = (int)(uVar12 >> 0x20);
      auVar17 = (auVar16 | auVar5) ^ auVar7;
      iVar15 = auVar14._4_4_;
      if ((bool)(~(auVar17._4_4_ == iVar15 && auVar14._0_4_ < auVar17._0_4_ ||
                  iVar15 < auVar17._4_4_) & 1)) {
        pvVar10[-3].typ = VM_NIL;
      }
      if ((auVar17._12_4_ != auVar14._12_4_ || auVar17._8_4_ <= auVar14._8_4_) &&
          auVar17._12_4_ <= auVar14._12_4_) {
        pvVar10[-2].typ = VM_NIL;
      }
      auVar16 = (auVar16 | auVar6) ^ auVar7;
      iVar18 = auVar16._4_4_;
      if (iVar18 <= iVar15 && (iVar18 != iVar15 || auVar16._0_4_ <= auVar14._0_4_)) {
        pvVar10[-1].typ = VM_NIL;
        pvVar10->typ = VM_NIL;
      }
      uVar12 = uVar12 + 4;
      pvVar10 = pvVar10 + 4;
    } while ((uVar2 + 3 & 0xfffffffc) != uVar12);
  }
  return pbVar1 + this->funchdr_size_;
}

Assistant:

const uchar *CVmRun::do_call_func_nr(VMG_ uint caller_ofs,
                                     pool_ofs_t target_ofs, uint argc)
{
    const uchar *target_ofs_ptr;
    CVmFuncPtr hdr_ptr;
    uint i;
    vm_val_t *fp;
    int lcl_cnt;

    /* store nil in R0 */
    r0_.set_nil();

    /* translate the target address */
    target_ofs_ptr = (const uchar *)G_code_pool->get_ptr(target_ofs);

    /* set up a pointer to the new function header */
    hdr_ptr.set(target_ofs_ptr);

    /* get the number of locals from the header */
    lcl_cnt = hdr_ptr.get_local_cnt();

    /* get the target's stack space needs and check for stack overflow */
    if (!check_space(hdr_ptr.get_stack_depth() + 11))
        err_throw(VMERR_STACK_OVERFLOW);

    /* allocate the stack frame */
    fp = push(11 + lcl_cnt);

    /* there's no target property, target object, defining object, or self */
    (fp++)->set_propid(VM_INVALID_PROP);
    (fp++)->set_nil();
    (fp++)->set_nil();
    (fp++)->set_nil_obj();

    /* push the invokee */
    (fp++)->set_fnptr(target_ofs);

    /* push the frame reference slot */
    (fp++)->set_nil();

    /* push the native code descriptor (none for a non-recursive call) */
    (fp++)->set_codeptr(0);

    /* push the caller's code offset */
    (fp++)->set_codeofs(caller_ofs);

    /* push the current entrypoint code offset */
    (fp++)->set_codeptr(entry_ptr_native_);

    /* push the actual parameter count */
    (fp++)->set_int((int32_t)argc);

    /* push the current frame pointer */
    (fp++)->set_stack(frame_ptr_);

    /* verify the argument count */
    if (!hdr_ptr.argc_ok(argc))
        err_throw(VMERR_WRONG_NUM_OF_ARGS);

    /* set up the new stack frame */
    frame_ptr_ = fp;

    /* load EP with the new code offset */
    entry_ptr_native_ = target_ofs_ptr;

    /* push nil for each local */
    for (i = lcl_cnt ; i != 0 ; --i)
        (fp++)->set_nil();

    /* create and activate the new function's profiler frame */
    VM_IF_PROFILER(if (profiling_)
        prof_enter(vmg_ target_ofs_ptr));

    /* return the new program counter */
    return target_ofs_ptr + get_funchdr_size();
}